

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

void lys_compile_unres_disabled_bitenum_remove(lysf_ctx *ctx,lysc_type_bitenum_item *items)

{
  long local_40;
  ulong local_38;
  uint64_t last_u;
  uint64_t u;
  lysc_type_bitenum_item *items_local;
  lysf_ctx *ctx_local;
  
  last_u = 0;
  while( true ) {
    if (items == (lysc_type_bitenum_item *)0x0) {
      local_38 = 0;
    }
    else {
      local_38._0_4_ = items[-1].field_4;
      local_38._4_2_ = items[-1].flags;
      local_38._6_2_ = *(undefined2 *)&items[-1].field_0x26;
    }
    if (local_38 <= last_u) break;
    if ((items[last_u].flags & 0x100) == 0) {
      last_u = last_u + 1;
    }
    else {
      lysc_enum_item_free(ctx,items + last_u);
      if (items == (lysc_type_bitenum_item *)0x0) {
        local_40 = 0;
      }
      else {
        local_40._0_4_ = items[-1].field_4;
        local_40._4_2_ = items[-1].flags;
        local_40._6_2_ = *(undefined2 *)&items[-1].field_0x26;
      }
      if (last_u < local_40 - 1U) {
        memmove(items + last_u,items + last_u + 1,((local_40 - 1U) - last_u) * 0x28);
      }
      *(long *)&items[-1].field_4 = *(long *)&items[-1].field_4 + -1;
    }
  }
  return;
}

Assistant:

static void
lys_compile_unres_disabled_bitenum_remove(struct lysf_ctx *ctx, struct lysc_type_bitenum_item *items)
{
    LY_ARRAY_COUNT_TYPE u = 0, last_u;

    while (u < LY_ARRAY_COUNT(items)) {
        if (items[u].flags & LYS_DISABLED) {
            /* free the disabled item */
            lysc_enum_item_free(ctx, &items[u]);

            /* replace it with the following items */
            last_u = LY_ARRAY_COUNT(items) - 1;
            if (u < last_u) {
                memmove(items + u, items + u + 1, (last_u - u) * sizeof *items);
            }

            /* one item less */
            LY_ARRAY_DECREMENT(items);
            continue;
        }

        ++u;
    }
}